

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zesDeviceSetEccState
          (zes_device_handle_t hDevice,zes_device_ecc_desc_t *newState,
          zes_device_ecc_properties_t *pState)

{
  zes_pfnDeviceSetEccState_t pfnSetEccState;
  ze_result_t result;
  zes_device_ecc_properties_t *pState_local;
  zes_device_ecc_desc_t *newState_local;
  zes_device_handle_t hDevice_local;
  
  pfnSetEccState._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011caa0 != (code *)0x0) {
    pfnSetEccState._4_4_ = (*DAT_0011caa0)(hDevice,newState,pState);
  }
  return pfnSetEccState._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDeviceSetEccState(
        zes_device_handle_t hDevice,                    ///< [in] Handle for the component.
        const zes_device_ecc_desc_t* newState,          ///< [in] Pointer to desired ECC state.
        zes_device_ecc_properties_t* pState             ///< [out] ECC state, pending state, and pending action for state change.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnSetEccState = context.zesDdiTable.Device.pfnSetEccState;
        if( nullptr != pfnSetEccState )
        {
            result = pfnSetEccState( hDevice, newState, pState );
        }
        else
        {
            // generic implementation
        }

        return result;
    }